

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQInstance::InstanceOf(SQInstance *this,SQClass *trg)

{
  SQClass *local_28;
  SQClass *parent;
  SQClass *trg_local;
  SQInstance *this_local;
  
  local_28 = this->_class;
  while( true ) {
    if (local_28 == (SQClass *)0x0) {
      return false;
    }
    if (local_28 == trg) break;
    local_28 = local_28->_base;
  }
  return true;
}

Assistant:

bool SQInstance::InstanceOf(SQClass *trg)
{
    SQClass *parent = _class;
    while(parent != NULL) {
        if(parent == trg)
            return true;
        parent = parent->_base;
    }
    return false;
}